

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread.c
# Opt level: O3

ppointer pp_uthread_proxy(ppointer data)

{
  p_uthread_set_local(pp_uthread_specific_data,data);
  p_spinlock_lock(pp_uthread_new_spin);
  p_spinlock_unlock(pp_uthread_new_spin);
  if (*(long *)((long)data + 0x28) != 0) {
    p_uthread_set_name_internal((PUThread *)data);
  }
  (**(code **)((long)data + 0x10))(*(undefined8 *)((long)data + 0x18));
  return (ppointer)0x0;
}

Assistant:

static ppointer
pp_uthread_proxy (ppointer data)
{
	PUThreadBase *base_thread = data;

	p_uthread_set_local (pp_uthread_specific_data, data);

	p_spinlock_lock (pp_uthread_new_spin);
	p_spinlock_unlock (pp_uthread_new_spin);

	if (base_thread->name != NULL)
		p_uthread_set_name_internal ((PUThread *) base_thread);

	base_thread->func (base_thread->data);

	return NULL;
}